

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_entry *
vstumpless_load_entry
          (stumpless_entry *entry,stumpless_facility facility,stumpless_severity severity,
          char *app_name,char *msgid,char *message,__va_list_tag *subs)

{
  char *message_00;
  stumpless_entry *psVar1;
  size_t msg_length;
  size_t local_38;
  
  if (message == (char *)0x0) {
    local_38 = 0;
    message_00 = (char *)0x0;
  }
  else {
    message_00 = no_vsnprintf_s_format_string(message,subs,&local_38);
    if (message_00 == (char *)0x0) {
      return (stumpless_entry *)0x0;
    }
  }
  clear_error();
  psVar1 = unchecked_load_entry(entry,facility,severity,app_name,msgid,message_00,local_38);
  if (psVar1 == (stumpless_entry *)0x0) {
    free_mem(message_00);
  }
  return psVar1;
}

Assistant:

struct stumpless_entry *
vstumpless_load_entry( struct stumpless_entry *entry,
                       enum stumpless_facility facility,
                       enum stumpless_severity severity,
                       const char *app_name,
                       const char *msgid,
                       const char *message,
                       va_list subs ) {
  char *msg;
  size_t msg_length;
  struct stumpless_entry *result;

  if( message ) {
    msg = config_format_string( message, subs, &msg_length );
    if( !msg ) {
      return NULL;
    }

  } else {
    msg = NULL;
    msg_length = 0;
  }

  clear_error(  );
  result = unchecked_load_entry( entry,
                                 facility,
                                 severity,
                                 app_name,
                                 msgid,
                                 msg,
                                 msg_length );

  if( !result ) {
    free_mem( msg );
  }

  return result;
}